

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

void predict(svm_params *params,svm_example **ec_arr,float *scores,size_t n)

{
  svm_model *psVar1;
  float *pfVar2;
  size_t i;
  size_t sVar3;
  size_t sVar4;
  float dot_prod;
  float fVar5;
  
  psVar1 = params->model;
  for (sVar3 = 0; sVar3 != n; sVar3 = sVar3 + 1) {
    svm_example::compute_kernels(ec_arr[sVar3],params);
    pfVar2 = (ec_arr[sVar3]->krow)._begin;
    if ((ec_arr[sVar3]->krow)._end == pfVar2) {
      fVar5 = 0.0;
    }
    else {
      fVar5 = 0.0;
      for (sVar4 = 0; psVar1->num_support != sVar4; sVar4 = sVar4 + 1) {
        fVar5 = fVar5 + pfVar2[sVar4] * (psVar1->alpha)._begin[sVar4];
      }
      fVar5 = fVar5 / params->lambda;
    }
    scores[sVar3] = fVar5;
  }
  return;
}

Assistant:

void predict(svm_params& params, svm_example** ec_arr, float* scores, size_t n)
{
  svm_model* model = params.model;
  for (size_t i = 0; i < n; i++)
  {
    ec_arr[i]->compute_kernels(params);
    // cout<<"size of krow = "<<ec_arr[i]->krow.size()<<endl;
    if (ec_arr[i]->krow.size() > 0)
      scores[i] = dense_dot(ec_arr[i]->krow.begin(), model->alpha, model->num_support) / params.lambda;
    else
      scores[i] = 0;
  }
}